

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::if_stmt(analysis *this)

{
  element_type *peVar1;
  int iVar2;
  TYPE TVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  analysis *in_RSI;
  NodePtr NVar5;
  NodePtr tmp_ptr;
  NodePtr local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *peStack_90;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  iVar2 = token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                iVar2);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->current_tab,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_98,(char (*) [3])"if",(int *)&local_a8);
  local_48._M_allocated_capacity = (size_type)&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"if","");
  match(in_RSI,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_allocated_capacity != &local_38) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)&local_a8);
  local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,1
               );
  TreeNode::setKind(*(TreeNode **)this,(int *)&local_a8);
  local_68._0_8_ = (token *)(local_68 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"(","");
  match(in_RSI,(string *)local_68);
  if ((token *)local_68._0_8_ != (token *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_);
  }
  assignment_expr((analysis *)&local_a8);
  local_88._0_8_ = (FILE *)(local_88 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,")","");
  match(in_RSI,(string *)local_88);
  if ((FILE *)local_88._0_8_ != (FILE *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  TreeNode::appendChild(*(TreeNode **)this,&local_a8);
  stmt((analysis *)&local_98);
  peVar1 = peStack_90;
  local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98._M_pi;
  _Var4._M_pi = local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_90 = (element_type *)0x0;
  local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
  if (peStack_90 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_90);
  }
  TreeNode::appendChild(*(TreeNode **)this,&local_a8);
  TVar3 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  _Var4._M_pi = extraout_RDX;
  if (TVar3 == ELSE) {
    stmt((analysis *)&local_98);
    peVar1 = peStack_90;
    local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_98._M_pi;
    _Var4._M_pi = local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_90 = (element_type *)0x0;
    local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    if (peStack_90 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_90);
    }
    TreeNode::appendChild(*(TreeNode **)this,&local_a8);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi
  ;
  NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar5.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::if_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in if_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("if",tmp->getLineno());
	match("if");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::IfK);

	match("(");
	NodePtr tmp_ptr = expr();
	match(")");
	ret->appendChild(tmp_ptr);

	tmp_ptr = stmt();
	ret->appendChild(tmp_ptr);

	if ( tmp->getType() == TYPE::ELSE)
	{
		tmp_ptr = stmt();
		ret->appendChild(tmp_ptr);
	}

	return ret;
}